

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seed.cpp
# Opt level: O3

Seed __thiscall jbcoin::generateSeed(jbcoin *this,string *passPhrase)

{
  undefined8 extraout_RDX;
  Seed SVar1;
  result_type digest;
  sha512_half_hasher_s h;
  Slice local_120;
  result_type local_110;
  SHA512_CTX local_f0;
  
  SHA512_Init(&local_f0);
  SHA512_Update(&local_f0,(passPhrase->_M_dataplus)._M_p,passPhrase->_M_string_length);
  detail::basic_sha512_half_hasher::operator_cast_to_base_uint
            (&local_110,(basic_sha512_half_hasher *)&local_f0);
  local_120.size_ = 0x10;
  local_120.data_ = (uint8_t *)&local_110;
  Seed::Seed((Seed *)this,&local_120);
  beast::secure_erase<void>(&local_f0,0xd8);
  SVar1.buf_._M_elems[8] = (char)extraout_RDX;
  SVar1.buf_._M_elems[9] = (char)((ulong)extraout_RDX >> 8);
  SVar1.buf_._M_elems[10] = (char)((ulong)extraout_RDX >> 0x10);
  SVar1.buf_._M_elems[0xb] = (char)((ulong)extraout_RDX >> 0x18);
  SVar1.buf_._M_elems[0xc] = (char)((ulong)extraout_RDX >> 0x20);
  SVar1.buf_._M_elems[0xd] = (char)((ulong)extraout_RDX >> 0x28);
  SVar1.buf_._M_elems[0xe] = (char)((ulong)extraout_RDX >> 0x30);
  SVar1.buf_._M_elems[0xf] = (char)((ulong)extraout_RDX >> 0x38);
  SVar1.buf_._M_elems._0_8_ = this;
  return (Seed)SVar1.buf_._M_elems;
}

Assistant:

Seed
generateSeed (std::string const& passPhrase)
{
    sha512_half_hasher_s h;
    h(passPhrase.data(), passPhrase.size());
    auto const digest =
        sha512_half_hasher::result_type(h);
    return Seed({ digest.data(), 16 });
}